

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

size_t ggml_backend_buft_get_alloc_size(ggml_backend_buffer_type_t buft,ggml_tensor *tensor)

{
  _func_size_t_ggml_backend_buffer_type_t_ggml_tensor_ptr *UNRECOVERED_JUMPTABLE;
  size_t sVar1;
  
  UNRECOVERED_JUMPTABLE = (buft->iface).get_alloc_size;
  if (UNRECOVERED_JUMPTABLE != (_func_size_t_ggml_backend_buffer_type_t_ggml_tensor_ptr *)0x0) {
    sVar1 = (*UNRECOVERED_JUMPTABLE)(buft,tensor);
    return sVar1;
  }
  sVar1 = ggml_nbytes(tensor);
  return sVar1;
}

Assistant:

size_t ggml_backend_buft_get_alloc_size(ggml_backend_buffer_type_t buft, struct ggml_tensor * tensor) {
    // get_alloc_size is optional, defaults to ggml_nbytes
    if (buft->iface.get_alloc_size) {
        size_t size = buft->iface.get_alloc_size(buft, tensor);
        assert(size >= ggml_nbytes(tensor));
        return size;
    }
    return ggml_nbytes(tensor);
}